

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TextureSwizzle::SmokeTest::isTargetSuppByFormat
          (SmokeTest *this,size_t format_idx,size_t target_idx)

{
  int iVar1;
  bool local_31;
  bool is_supported;
  _texture_target *source_target;
  _texture_format *format;
  size_t target_idx_local;
  size_t format_idx_local;
  SmokeTest *this_local;
  
  local_31 = true;
  iVar1 = *(int *)(texture_formats + format_idx * 0x78 + 4);
  if ((2 < iVar1 - 0x81a5U) && (iVar1 != 0x88f0)) {
    if (iVar1 == 0x8c3d) {
      return (*(uint *)(texture_targets + target_idx * 0x30 + 0x28) | 2) != 0x9102;
    }
    if (iVar1 != 0x8cac && iVar1 != 0x8cad) {
      return true;
    }
  }
  iVar1 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  if (((iVar1 == 0x806f) || (iVar1 == 0x9100)) || (iVar1 == 0x9102)) {
    local_31 = false;
  }
  return local_31;
}

Assistant:

bool SmokeTest::isTargetSuppByFormat(size_t format_idx, size_t target_idx)
{
	const _texture_format& format		 = texture_formats[format_idx];
	const _texture_target& source_target = texture_targets[target_idx];

	bool is_supported = true;

	switch (format.m_internal_format)
	{
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH24_STENCIL8:
	case GL_DEPTH32F_STENCIL8:
		switch (source_target.m_target)
		{
		case GL_TEXTURE_3D:
		case GL_TEXTURE_2D_MULTISAMPLE:
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_supported = false;
			break;
		default:
			break;
		}
		break;

	case GL_RGB9_E5:
		switch (source_target.m_target)
		{
		case GL_TEXTURE_2D_MULTISAMPLE:
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_supported = false;
			break;
		default:
			break;
		}
		break;

	default:
		break;
	}

	return is_supported;
}